

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Expression> __thiscall minja::Parser::parseLogicalCompare(Parser *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  runtime_error *prVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  shared_ptr<minja::Expression> sVar5;
  Op op;
  shared_ptr<minja::Expression> right;
  shared_ptr<minja::VariableExpr> identifier;
  bool negated;
  Location location;
  string op_str;
  shared_ptr<minja::Expression> left;
  shared_ptr<minja::BinaryOpExpr> *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  byte in_stack_fffffffffffffe57;
  string *in_stack_fffffffffffffe70;
  undefined6 in_stack_fffffffffffffe78;
  byte in_stack_fffffffffffffe7e;
  shared_ptr<minja::Expression> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Parser *in_stack_fffffffffffffea8;
  string local_130 [12];
  SpaceHandling in_stack_fffffffffffffedc;
  regex *in_stack_fffffffffffffee0;
  Parser *in_stack_fffffffffffffee8;
  string local_110 [36];
  undefined4 local_ec;
  __shared_ptr local_e8 [16];
  int local_d8;
  uint local_d4;
  __shared_ptr local_c0 [16];
  string local_b0 [39];
  byte local_89;
  string local_70 [32];
  string local_50 [48];
  __shared_ptr local_20 [32];
  
  __rhs = in_RDI;
  parseStringConcat(in_stack_fffffffffffffee8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (!bVar1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Expected left side of \'logical compare\' expression")
    ;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((parseLogicalCompare()::compare_tok_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parseLogicalCompare()::compare_tok_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)__rhs,(char *)in_RDI,
               (flag_type)((ulong)in_stack_fffffffffffffe80 >> 0x20));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parseLogicalCompare()::compare_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseLogicalCompare()::compare_tok_abi_cxx11_);
  }
  if ((parseLogicalCompare()::not_tok_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parseLogicalCompare()::not_tok_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)__rhs,(char *)in_RDI,
               (flag_type)((ulong)in_stack_fffffffffffffe80 >> 0x20));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parseLogicalCompare()::not_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseLogicalCompare()::not_tok_abi_cxx11_);
  }
  std::__cxx11::string::string(local_50);
  do {
    consumeToken(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    std::__cxx11::string::operator=(local_50,local_70);
    bVar2 = std::__cxx11::string::empty();
    bVar2 = bVar2 ^ 0xff;
    std::__cxx11::string::~string(local_70);
    if ((bVar2 & 1) == 0) {
      std::shared_ptr<minja::Expression>::shared_ptr
                ((shared_ptr<minja::Expression> *)
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 (shared_ptr<minja::Expression> *)in_stack_fffffffffffffe48);
      local_d8 = 1;
      break;
    }
    get_location(in_RSI);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                            (char *)in_stack_fffffffffffffe48);
    if (bVar1) {
      consumeToken(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      in_stack_fffffffffffffe70 = local_b0;
      in_stack_fffffffffffffe7e = std::__cxx11::string::empty();
      in_stack_fffffffffffffe7e = in_stack_fffffffffffffe7e ^ 1;
      std::__cxx11::string::~string(in_stack_fffffffffffffe70);
      local_89 = in_stack_fffffffffffffe7e;
      parseIdentifier(in_stack_fffffffffffffea8);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_c0);
      if (!bVar1) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Expected identifier after \'is\' keyword");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2edb40);
      local_d4 = local_89 & 1 | 0x12;
      std::
      make_shared<minja::BinaryOpExpr,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::VariableExpr>,minja::BinaryOpExpr::Op>
                ((Location *)in_RDI,in_stack_fffffffffffffe80,
                 (shared_ptr<minja::VariableExpr> *)
                 CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                 (Op *)in_stack_fffffffffffffe70);
      std::shared_ptr<minja::Expression>::shared_ptr<minja::BinaryOpExpr,void>
                ((shared_ptr<minja::Expression> *)
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      std::shared_ptr<minja::BinaryOpExpr>::~shared_ptr((shared_ptr<minja::BinaryOpExpr> *)0x2edb9f)
      ;
      local_d8 = 1;
      std::shared_ptr<minja::VariableExpr>::~shared_ptr((shared_ptr<minja::VariableExpr> *)0x2edbb7)
      ;
    }
    else {
      parseStringConcat(in_stack_fffffffffffffee8);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_e8);
      if (!bVar1) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar4,"Expected right side of \'logical compare\' expression");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                              (char *)in_stack_fffffffffffffe48);
      if (bVar1) {
        local_ec = 8;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                                (char *)in_stack_fffffffffffffe48);
        if (bVar1) {
          local_ec = 9;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                                  (char *)in_stack_fffffffffffffe48);
          if (bVar1) {
            local_ec = 10;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50)
                                    ,(char *)in_stack_fffffffffffffe48);
            if (bVar1) {
              local_ec = 0xb;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffe57,
                                                  in_stack_fffffffffffffe50),
                                      (char *)in_stack_fffffffffffffe48);
              if (bVar1) {
                local_ec = 0xc;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffffe57,
                                                    in_stack_fffffffffffffe50),
                                        (char *)in_stack_fffffffffffffe48);
                if (bVar1) {
                  local_ec = 0xd;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffffe57,
                                                      in_stack_fffffffffffffe50),
                                          (char *)in_stack_fffffffffffffe48);
                  if (bVar1) {
                    local_ec = 0x10;
                  }
                  else {
                    std::__cxx11::string::substr((ulong)local_110,(ulong)local_50);
                    in_stack_fffffffffffffe57 =
                         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT17(in_stack_fffffffffffffe57,
                                                     in_stack_fffffffffffffe50),
                                         (char *)in_stack_fffffffffffffe48);
                    std::__cxx11::string::~string(local_110);
                    if ((in_stack_fffffffffffffe57 & 1) == 0) {
                      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::operator+((char *)in_RSI,__rhs);
                      std::runtime_error::runtime_error(prVar4,local_130);
                      __cxa_throw(prVar4,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_ec = 0x11;
                  }
                }
              }
            }
          }
        }
      }
      get_location(in_RSI);
      std::
      make_shared<minja::BinaryOpExpr,minja::Location,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,minja::BinaryOpExpr::Op&>
                ((Location *)in_RDI,in_stack_fffffffffffffe80,
                 (shared_ptr<minja::Expression> *)
                 CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                 (Op *)in_stack_fffffffffffffe70);
      std::shared_ptr<minja::Expression>::operator=
                ((shared_ptr<minja::Expression> *)
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      std::shared_ptr<minja::BinaryOpExpr>::~shared_ptr((shared_ptr<minja::BinaryOpExpr> *)0x2edf14)
      ;
      Location::~Location((Location *)0x2edf1e);
      std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2edf2b);
      local_d8 = 0;
    }
    Location::~Location((Location *)0x2edf43);
  } while (local_d8 == 0);
  std::__cxx11::string::~string(local_50);
  std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2edfc6);
  sVar5.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__rhs;
  return (shared_ptr<minja::Expression>)
         sVar5.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseLogicalCompare() {
        auto left = parseStringConcat();
        if (!left) throw std::runtime_error("Expected left side of 'logical compare' expression");

        static std::regex compare_tok(R"(==|!=|<=?|>=?|in\b|is\b|not\s+in\b)");
        static std::regex not_tok(R"(not\b)");
        std::string op_str;
        while (!(op_str = consumeToken(compare_tok)).empty()) {
            auto location = get_location();
            if (op_str == "is") {
              auto negated = !consumeToken(not_tok).empty();

              auto identifier = parseIdentifier();
              if (!identifier) throw std::runtime_error("Expected identifier after 'is' keyword");

              return std::make_shared<BinaryOpExpr>(
                  left->location,
                  std::move(left), std::move(identifier),
                  negated ? BinaryOpExpr::Op::IsNot : BinaryOpExpr::Op::Is);
            }
            auto right = parseStringConcat();
            if (!right) throw std::runtime_error("Expected right side of 'logical compare' expression");
            BinaryOpExpr::Op op;
            if (op_str == "==") op = BinaryOpExpr::Op::Eq;
            else if (op_str == "!=") op = BinaryOpExpr::Op::Ne;
            else if (op_str == "<") op = BinaryOpExpr::Op::Lt;
            else if (op_str == ">") op = BinaryOpExpr::Op::Gt;
            else if (op_str == "<=") op = BinaryOpExpr::Op::Le;
            else if (op_str == ">=") op = BinaryOpExpr::Op::Ge;
            else if (op_str == "in") op = BinaryOpExpr::Op::In;
            else if (op_str.substr(0, 3) == "not") op = BinaryOpExpr::Op::NotIn;
            else throw std::runtime_error("Unknown comparison operator: " + op_str);
            left = std::make_shared<BinaryOpExpr>(get_location(), std::move(left), std::move(right), op);
        }
        return left;
    }